

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O1

void sysbvm_jit_makeDictionary
               (sysbvm_bytecodeJit_t *jit,int16_t resultOperand,size_t elementCount,
               int16_t *elementOperands)

{
  sysbvm_x86_register_t reg;
  size_t sVar1;
  uint8_t local_37 [7];
  
  if (-1 < resultOperand) {
    sysbvm_bytecodeJit_addBytes(jit,7,local_37);
    sysbvm_bytecodeJit_addBytes(jit,7,local_37);
    sysbvm_jit_x86_call(jit,sysbvm_dictionary_createWithCapacity);
    sysbvm_jit_moveRegisterToOperand(jit,resultOperand,reg);
    if (elementCount != 0) {
      sVar1 = 0;
      do {
        sysbvm_bytecodeJit_addBytes(jit,7,local_37);
        sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG1,resultOperand);
        sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG2,elementOperands[sVar1]);
        sysbvm_jit_x86_call(jit,sysbvm_dictionary_add);
        sVar1 = sVar1 + 1;
      } while (elementCount != sVar1);
    }
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_jit_makeDictionary(sysbvm_bytecodeJit_t *jit, int16_t resultOperand, size_t elementCount, int16_t *elementOperands)
{
    if(resultOperand < 0)
        return;

    sysbvm_jit_x86_jitLoadContextInRegister(jit, SYSBVM_X86_64_ARG0);
    sysbvm_jit_x86_movImmediate32(jit, SYSBVM_X86_64_ARG1, (int32_t)elementCount);
    sysbvm_jit_x86_call(jit, &sysbvm_dictionary_createWithCapacity);
    sysbvm_jit_moveRegisterToOperand(jit, resultOperand, SYSBVM_X86_RAX);

    for(size_t i = 0; i < elementCount; ++i)
    {
        sysbvm_jit_x86_jitLoadContextInRegister(jit, SYSBVM_X86_64_ARG0);
        sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG1, resultOperand);
        sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG2, elementOperands[i]);
        sysbvm_jit_x86_call(jit, &sysbvm_dictionary_add);
    }
}